

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

void __thiscall
EthUdpPort::EthUdpPort
          (EthUdpPort *this,int portNum,string *serverIP,bool forceFwBridge,ostream *debugStream,
          EthCallbackType cb)

{
  uint uVar1;
  SocketInternals *this_00;
  ostream *poVar2;
  allocator<char> local_45 [13];
  EthCallbackType local_38;
  EthCallbackType cb_local;
  ostream *debugStream_local;
  string *psStack_20;
  bool forceFwBridge_local;
  string *serverIP_local;
  EthUdpPort *pEStack_10;
  int portNum_local;
  EthUdpPort *this_local;
  
  local_38 = cb;
  cb_local = (EthCallbackType)debugStream;
  debugStream_local._7_1_ = forceFwBridge;
  psStack_20 = serverIP;
  serverIP_local._4_4_ = portNum;
  pEStack_10 = this;
  EthBasePort::EthBasePort(&this->super_EthBasePort,portNum,forceFwBridge,debugStream,cb);
  (this->super_EthBasePort).super_BasePort._vptr_BasePort = (_func_int **)&PTR_Init_00135b98;
  std::__cxx11::string::string((string *)&this->ServerIP,(string *)psStack_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->MulticastIP,"224.0.0.100",local_45);
  std::allocator<char>::~allocator(local_45);
  this->UDP_port = 0x572;
  this_00 = (SocketInternals *)operator_new(0x68);
  SocketInternals::SocketInternals(this_00,(ostream *)cb_local);
  this->sockPtr = this_00;
  uVar1 = (**(this->super_EthBasePort).super_BasePort._vptr_BasePort)();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,"Initialization failed"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,"Initialization done");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

EthUdpPort::EthUdpPort(int portNum, const std::string &serverIP, bool forceFwBridge, std::ostream &debugStream, EthCallbackType cb):
    EthBasePort(portNum, forceFwBridge, debugStream, cb),
    ServerIP(serverIP),
    MulticastIP(ETH_UDP_MULTICAST_DEFAULT_IP),
    UDP_port(1394)
{
    sockPtr = new SocketInternals(debugStream);
    if (Init())
        outStr << "Initialization done" << std::endl;
    else
        outStr << "Initialization failed" << std::endl;
}